

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
PS2KeyboardSimulationDataGenerator::SendByte(PS2KeyboardSimulationDataGenerator *this,U8 payload)

{
  uint uVar1;
  int iVar2;
  
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mClock);
  uVar1 = (int)this + 0x10;
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  iVar2 = 8;
  do {
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(2.0);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  iVar2 = 8;
  do {
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  ClockGenerator::AdvanceByTimeS(0.001);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  return;
}

Assistant:

void PS2KeyboardSimulationDataGenerator::SendByte( U8 payload )
{
    mClock->TransitionIfNeeded( BIT_HIGH );
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );


    // make a copy of the data for calculating parity bit later
    U8 copyofpayload = payload;

    // start bit
    mData->TransitionIfNeeded( BIT_LOW );

    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    // data, lsb first
    for( int i = 0; i < 8; i++ )
    {
        if( payload & 0x01 )
        {
            mData->TransitionIfNeeded( BIT_HIGH );
            payload = payload >> 1;
        }
        else
        {
            mData->TransitionIfNeeded( BIT_LOW );
            payload = payload >> 1;
        }

        mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

        mClock->Transition();
        mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );

        mClock->Transition();
        mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );
    }
    // parity bit
    int ones = 0;

    // sum the ones
    for( U32 j = 0; j < 8; j++ )
    {
        ones = ones + ( copyofpayload & 0x01 );
        copyofpayload = copyofpayload >> 1;
    }

    // if lsb of ones is 1, then there is an odd number of ones, therefore parity =0

    if( ones & 0x01 )
        mData->TransitionIfNeeded( BIT_LOW );
    else
        mData->TransitionIfNeeded( BIT_HIGH );

    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );
    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    // stop bit
    mData->TransitionIfNeeded( BIT_HIGH );
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );
    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );

    // advance to the next time of transmission
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( .001 ) );
}